

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O0

void Fxch_DivisorRemove(Fxch_Man_t *p,int Lit0,int Lit1,int Weight)

{
  int iVar1;
  int *piVar2;
  int local_20;
  int iDiv;
  int Weight_local;
  int Lit1_local;
  int Lit0_local;
  Fxch_Man_t *p_local;
  
  if (Lit0 == Lit1) {
    __assert_fail("Lit0 != Lit1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0x174,"void Fxch_DivisorRemove(Fxch_Man_t *, int, int, int)");
  }
  if (Lit0 < Lit1) {
    piVar2 = Hash_Int2ManLookup(p->vHash,Lit0,Lit1);
    local_20 = *piVar2;
  }
  else {
    piVar2 = Hash_Int2ManLookup(p->vHash,Lit1,Lit0);
    local_20 = *piVar2;
  }
  if (0 < local_20) {
    iVar1 = Vec_FltSize(&p->vWeights);
    if (local_20 < iVar1) {
      Vec_FltAddToEntry(&p->vWeights,local_20,(float)-Weight);
      iVar1 = Vec_QueIsMember(p->vPrio,local_20);
      if (iVar1 != 0) {
        Vec_QueUpdate(p->vPrio,local_20);
      }
      return;
    }
  }
  __assert_fail("iDiv > 0 && iDiv < Vec_FltSize(&p->vWeights)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                ,0x179,"void Fxch_DivisorRemove(Fxch_Man_t *, int, int, int)");
}

Assistant:

void Fxch_DivisorRemove( Fxch_Man_t * p, int Lit0, int Lit1, int Weight )
{
    int iDiv;
    assert( Lit0 != Lit1 );
    if ( Lit0 < Lit1 )
        iDiv = *Hash_Int2ManLookup( p->vHash, Lit0, Lit1 );
    else
        iDiv = *Hash_Int2ManLookup( p->vHash, Lit1, Lit0 );
    assert( iDiv > 0 && iDiv < Vec_FltSize(&p->vWeights) );
    Vec_FltAddToEntry( &p->vWeights, iDiv, -Weight );
    if ( Vec_QueIsMember(p->vPrio, iDiv) )
        Vec_QueUpdate( p->vPrio, iDiv );
}